

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  REF_INT local_100;
  REF_INT local_fc;
  REF_INT local_f8;
  int local_f4;
  REF_INT local_f0;
  REF_INT local_ec;
  int local_e8;
  REF_INT local_e4;
  int local_e0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT have_match;
  REF_INT nodes [27];
  int local_44;
  REF_INT cell;
  REF_INT cell_item;
  REF_INT geom;
  REF_INT geom_item;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  if ((node < 0) || (ref_geom_00->ref_adj->nnode <= node)) {
    local_e0 = -1;
  }
  else {
    local_e0 = ref_geom_00->ref_adj->first[node];
  }
  cell_item = local_e0;
  if (local_e0 == -1) {
    local_e4 = -1;
  }
  else {
    local_e4 = ref_geom_00->ref_adj->item[local_e0].ref;
  }
  cell = local_e4;
  do {
    if (cell_item == -1) {
      return 0;
    }
    if (ref_geom_00->descr[cell * 6] == 1) {
      bVar2 = false;
      pRVar1 = ref_grid->cell[0];
      if ((node < 0) || (pRVar1->ref_adj->nnode <= node)) {
        local_e8 = -1;
      }
      else {
        local_e8 = pRVar1->ref_adj->first[node];
      }
      local_44 = local_e8;
      if (local_e8 == -1) {
        local_ec = -1;
      }
      else {
        local_ec = pRVar1->ref_adj->item[local_e8].ref;
      }
      nodes[0x1a] = local_ec;
      while (local_44 != -1) {
        uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x843,"ref_geom_report_topo_at",(ulong)uVar3,"edg nodes");
          return uVar3;
        }
        if (ref_geom_00->descr[cell * 6 + 1] == (&ref_private_macro_code_rss)[pRVar1->node_per]) {
          bVar2 = true;
        }
        local_44 = pRVar1->ref_adj->item[local_44].next;
        if (local_44 == -1) {
          local_f0 = -1;
        }
        else {
          local_f0 = pRVar1->ref_adj->item[local_44].ref;
        }
        nodes[0x1a] = local_f0;
      }
      if (!bVar2) {
        uVar3 = ref_node_location(ref_node_00,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x849,"ref_geom_report_topo_at",(ulong)uVar3,"loc");
          return uVar3;
        }
        uVar3 = ref_geom_tattle(ref_geom_00,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x84a,"ref_geom_report_topo_at",(ulong)uVar3,"geom tatt");
          return uVar3;
        }
        uVar3 = ref_cell_tattle_about(pRVar1,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x84b,"ref_geom_report_topo_at",(ulong)uVar3,"cell tatt");
          return uVar3;
        }
      }
    }
    if (ref_geom_00->descr[cell * 6] == 2) {
      bVar2 = false;
      pRVar1 = ref_grid->cell[3];
      if ((node < 0) || (pRVar1->ref_adj->nnode <= node)) {
        local_f4 = -1;
      }
      else {
        local_f4 = pRVar1->ref_adj->first[node];
      }
      local_44 = local_f4;
      if (local_f4 == -1) {
        local_f8 = -1;
      }
      else {
        local_f8 = pRVar1->ref_adj->item[local_f4].ref;
      }
      nodes[0x1a] = local_f8;
      while (local_44 != -1) {
        uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x852,"ref_geom_report_topo_at",(ulong)uVar3,"tri nodes");
          return uVar3;
        }
        if (ref_geom_00->descr[cell * 6 + 1] == (&ref_private_macro_code_rss)[pRVar1->node_per]) {
          bVar2 = true;
        }
        local_44 = pRVar1->ref_adj->item[local_44].next;
        if (local_44 == -1) {
          local_fc = -1;
        }
        else {
          local_fc = pRVar1->ref_adj->item[local_44].ref;
        }
        nodes[0x1a] = local_fc;
      }
      if (!bVar2) {
        uVar3 = ref_node_location(ref_node_00,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x858,"ref_geom_report_topo_at",(ulong)uVar3,"loc");
          return uVar3;
        }
        uVar3 = ref_geom_tattle(ref_geom_00,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x859,"ref_geom_report_topo_at",(ulong)uVar3,"geom tatt");
          return uVar3;
        }
        uVar3 = ref_cell_tattle_about(pRVar1,node);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x85a,"ref_geom_report_topo_at",(ulong)uVar3,"cell tatt");
          return uVar3;
        }
      }
    }
    cell_item = ref_geom_00->ref_adj->item[cell_item].next;
    if (cell_item == -1) {
      local_100 = -1;
    }
    else {
      local_100 = ref_geom_00->ref_adj->item[cell_item].ref;
    }
    cell = local_100;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT geom_item, geom;
  REF_INT cell_item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT have_match;

  each_ref_geom_having_node(ref_geom, node, geom_item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_edg(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "edg nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "tri nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
  }

  return REF_SUCCESS;
}